

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::PsbtInputRequestData::ConvertFromStruct
          (PsbtInputRequestData *this,PsbtInputRequestDataStruct *data)

{
  PsbtInputRequestDataStruct *data_local;
  PsbtInputRequestData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->utxo_full_tx_,(string *)data);
  TxOutRequest::ConvertFromStruct(&this->witness_utxo_,&data->witness_utxo);
  std::__cxx11::string::operator=((string *)&this->redeem_script_,(string *)&data->redeem_script);
  core::
  JsonObjectVector<cfd::js::api::json::PsbtBip32PubkeyInput,_cfd::js::api::PsbtBip32PubkeyInputStruct>
  ::ConvertFromStruct(&this->bip32_derives_,&data->bip32_derives);
  std::__cxx11::string::operator=((string *)&this->sighash_,(string *)&data->sighash);
  core::
  JsonObjectVector<cfd::js::api::json::PsbtSignatureData,_cfd::js::api::PsbtSignatureDataStruct>::
  ConvertFromStruct(&this->partial_signature_,&data->partial_signature);
  core::JsonObjectVector<cfd::js::api::json::PsbtMapData,_cfd::js::api::PsbtMapDataStruct>::
  ConvertFromStruct(&this->unknown_,&data->unknown);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void PsbtInputRequestData::ConvertFromStruct(
    const PsbtInputRequestDataStruct& data) {
  utxo_full_tx_ = data.utxo_full_tx;
  witness_utxo_.ConvertFromStruct(data.witness_utxo);
  redeem_script_ = data.redeem_script;
  bip32_derives_.ConvertFromStruct(data.bip32_derives);
  sighash_ = data.sighash;
  partial_signature_.ConvertFromStruct(data.partial_signature);
  unknown_.ConvertFromStruct(data.unknown);
  ignore_items = data.ignore_items;
}